

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HeapInfo.h
# Opt level: O3

SmallHeapBlockBitVector * __thiscall
Memory::HeapInfo::ValidPointersMap<SmallAllocationBlockAttributes>::GetInvalidBitVector
          (ValidPointersMap<SmallAllocationBlockAttributes> *this,uint index)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  
  if (0x2f < index) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/HeapInfo.h"
                       ,0x186,"(index < TBlockAttributes::BucketCount)",
                       "index < TBlockAttributes::BucketCount");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  }
  return this->invalidBitsBuffers + index;
}

Assistant:

inline const typename SmallHeapBlockT<TBlockAttributes>::SmallHeapBlockBitVector * GetInvalidBitVector(uint index) const
        {
            AnalysisAssert(index < TBlockAttributes::BucketCount);
#if USE_STATIC_VPM
            return &(*invalidBitsBuffers)[index];
#else
            return &invalidBitsBuffers[index];
#endif
        }